

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O1

REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (ref_cloud->max == ref_cloud->n) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    if (0 < (long)ref_cloud->max) {
      pRVar5 = (REF_GLOB *)realloc(ref_cloud->global,(long)ref_cloud->max << 3);
      ref_cloud->global = pRVar5;
    }
    if (ref_cloud->global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x58,
             "ref_cloud_store","realloc ref_cloud->global NULL");
      uVar3 = ref_cloud->max;
    }
    else {
      fflush(_stdout);
      uVar3 = ref_cloud->max * ref_cloud->naux;
      if (0 < (int)uVar3) {
        pRVar6 = (REF_DBL *)realloc(ref_cloud->aux,(ulong)uVar3 << 3);
        ref_cloud->aux = pRVar6;
      }
      if (ref_cloud->aux != (REF_DBL *)0x0) goto LAB_002158fd;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x5a,
             "ref_cloud_store","realloc ref_cloud->aux NULL");
      uVar3 = ref_cloud->max * ref_cloud->naux;
    }
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar3,(long)(int)uVar3,
           8,(long)(int)uVar3 * 8);
    RVar4 = 2;
  }
  else {
LAB_002158fd:
    uVar3 = ref_cloud->n;
    uVar9 = (ulong)uVar3;
    lVar10 = (long)(int)uVar3;
    uVar8 = uVar3 + 1;
    do {
      iVar7 = (int)uVar9;
      if (iVar7 < 1) {
        uVar8 = 0;
        break;
      }
      lVar11 = uVar9 - 1;
      if (ref_cloud->global[lVar11] == global) {
        iVar2 = ref_cloud->naux;
        if (0 < (long)iVar2) {
          pRVar6 = ref_cloud->aux;
          lVar10 = 0;
          do {
            pRVar6[(iVar7 + -1) * iVar2 + lVar10] = aux[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar2 != lVar10);
          return 0;
        }
        goto LAB_00215a24;
      }
      uVar8 = uVar8 - 1;
      uVar9 = uVar9 - 1;
    } while (global <= ref_cloud->global[lVar11]);
    if ((int)uVar8 < (int)uVar3) {
      pRVar5 = ref_cloud->global;
      do {
        pRVar5[lVar10] = pRVar5[lVar10 + -1];
        lVar10 = lVar10 + -1;
      } while ((int)uVar8 < lVar10);
    }
    if ((int)uVar8 < (int)uVar3) {
      uVar1 = ref_cloud->naux;
      lVar10 = (long)(int)uVar3;
      lVar11 = (long)(int)uVar1;
      lVar12 = lVar10 * lVar11 * 8;
      lVar13 = (lVar10 + -1) * lVar11 * 8;
      do {
        if (0 < (int)uVar1) {
          pRVar6 = ref_cloud->aux;
          uVar9 = 0;
          do {
            *(undefined8 *)((long)pRVar6 + uVar9 * 8 + lVar12) =
                 *(undefined8 *)((long)pRVar6 + uVar9 * 8 + lVar13);
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        lVar10 = lVar10 + -1;
        lVar12 = lVar12 + lVar11 * -8;
        lVar13 = lVar13 + lVar11 * -8;
      } while ((int)uVar8 < lVar10);
    }
    ref_cloud->n = uVar3 + 1;
    ref_cloud->global[uVar8] = global;
    iVar2 = ref_cloud->naux;
    if ((long)iVar2 < 1) {
LAB_00215a24:
      RVar4 = 0;
    }
    else {
      RVar4 = 0;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      pRVar6 = ref_cloud->aux;
      lVar10 = 0;
      do {
        pRVar6[(ulong)(uint)(iVar7 * iVar2) + lVar10] = aux[lVar10];
        lVar10 = lVar10 + 1;
      } while (iVar2 != lVar10);
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud, REF_GLOB global,
                                   REF_DBL *aux) {
  REF_INT item, i, insert_point;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  insert_point = 0;
  for (item = ref_cloud_n(ref_cloud) - 1; item >= 0; item--) {
    if (ref_cloud_global(ref_cloud, item) == global) { /* replace aux */
      each_ref_cloud_aux(ref_cloud, i) {
        ref_cloud_aux(ref_cloud, i, item) = aux[i];
      }
      return REF_SUCCESS;
    }
    if (ref_cloud_global(ref_cloud, item) < global) {
      insert_point = item + 1;
      break;
    }
  }
  /* shift to open up insert_point */
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    ref_cloud_global(ref_cloud, item) = ref_cloud_global(ref_cloud, item - 1);
  }
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    each_ref_cloud_aux(ref_cloud, i) {
      ref_cloud_aux(ref_cloud, i, item) = ref_cloud_aux(ref_cloud, i, item - 1);
    }
  }
  /* fill insert_point */
  ref_cloud_n(ref_cloud)++;
  item = insert_point;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}